

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfRationalAttribute.cpp
# Opt level: O1

void __thiscall
Imf_3_4::TypedAttribute<Imf_3_4::Rational>::writeValueTo
          (TypedAttribute<Imf_3_4::Rational> *this,OStream *os,int version)

{
  undefined8 in_RAX;
  int local_18;
  uint local_14;
  
  _local_18 = CONCAT44((uint)((ulong)in_RAX >> 0x20),(this->_value).n);
  (*os->_vptr_OStream[2])(os,&local_18,4);
  _local_18 = CONCAT44((this->_value).d,local_18);
  (*os->_vptr_OStream[2])(os,&local_14,4);
  return;
}

Assistant:

IMF_EXPORT void
RationalAttribute::writeValueTo (
    OPENEXR_IMF_INTERNAL_NAMESPACE::OStream& os, int version) const
{
    Xdr::write<StreamIO> (os, _value.n);
    Xdr::write<StreamIO> (os, _value.d);
}